

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O1

void math::internal::matrix_gk_svd_step<double>
               (int rows,int cols,double *mat_b,double *mat_q,double *mat_p,int p,int q,
               double *epsilon)

{
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  int iVar5;
  double dVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [8];
  double *pdVar11;
  int j;
  ulong uVar12;
  int j_1;
  uint uVar13;
  double *pdVar14;
  uint rows_a;
  double *pdVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 local_f8 [8];
  vector<double,_std::allocator<double>_> buffer;
  double *local_b8;
  double *local_a0;
  double local_70;
  double beta;
  ulong local_60;
  double *local_58;
  uint local_4c;
  double local_48;
  double alpha;
  double givens_c;
  double givens_s;
  
  local_60 = (ulong)(uint)(cols - q);
  rows_a = (cols - q) - p;
  uVar13 = rows_a * rows_a;
  local_58 = mat_b;
  local_4c = rows;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_f8,(ulong)(uVar13 * 3),
             (allocator_type *)&local_48);
  pdVar14 = local_58;
  pdVar1 = (double *)((long)local_f8 + (ulong)uVar13 * 8);
  uVar3 = (ulong)rows_a;
  if (0 < (int)rows_a) {
    uVar8 = (ulong)(uint)((cols + 1) * p);
    uVar9 = 0;
    auVar10 = local_f8;
    do {
      uVar12 = 0;
      do {
        *(double *)((long)auVar10 + uVar12 * 8) = local_58[(int)uVar8 + (int)uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar3);
      uVar9 = uVar9 + 1;
      auVar10 = (undefined1  [8])((long)auVar10 + uVar3 * 8);
      uVar8 = uVar8 + (uint)cols;
    } while (uVar9 < uVar3);
  }
  pdVar15 = pdVar1 + uVar13;
  if (0 < (int)rows_a) {
    uVar8 = 0;
    auVar10 = local_f8;
    pdVar11 = pdVar1;
    do {
      uVar9 = 0;
      pdVar4 = (double *)auVar10;
      do {
        pdVar11[uVar9] = *pdVar4;
        uVar9 = uVar9 + 1;
        pdVar4 = pdVar4 + uVar3;
      } while (uVar9 < uVar3);
      uVar8 = uVar8 + 1;
      pdVar11 = pdVar11 + uVar3;
      auVar10 = (undefined1  [8])((long)auVar10 + 8);
    } while (uVar8 < uVar3);
  }
  beta = (double)(ulong)(uint)cols;
  matrix_multiply<double>((double *)local_f8,rows_a,rows_a,pdVar1,rows_a,pdVar15);
  uVar3 = local_60;
  iVar2 = (rows_a - 2) * rows_a;
  iVar5 = (rows_a - 1) * rows_a;
  dVar6 = pdVar15[(int)(iVar5 + -1 + rows_a)];
  dVar19 = pdVar15[(int)(iVar2 + rows_a + -2)] + dVar6;
  dVar16 = pdVar15[(int)(iVar2 + rows_a + -1)] * pdVar15[(int)(iVar5 + rows_a + -2)] +
           (dVar19 * dVar19 * 0.25 - pdVar15[(int)(iVar2 + rows_a + -2)] * dVar6);
  dVar18 = 0.0;
  if (0.0 < dVar16) {
    if (dVar16 < 0.0) {
      dVar18 = sqrt(dVar16);
    }
    else {
      dVar18 = SQRT(dVar16);
    }
  }
  pdVar1 = local_58;
  dVar16 = beta;
  dVar17 = dVar19 * 0.5 - dVar18;
  dVar18 = dVar19 * 0.5 + dVar18;
  uVar8 = -(ulong)(ABS(dVar6 - dVar17) < ABS(dVar6 - dVar18));
  local_70 = pdVar14[p * cols + p];
  local_48 = local_70 * local_70 - (double)(~uVar8 & (ulong)dVar18 | (ulong)dVar17 & uVar8);
  local_70 = local_70 * pdVar14[p * cols + 1 + p];
  iVar2 = (int)uVar3 + -1;
  if (p < iVar2) {
    uVar9 = (ulong)local_4c;
    uVar8 = (ulong)p;
    lVar7 = (long)cols;
    buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(long)iVar2;
    local_b8 = local_58 + uVar8 + 1;
    local_a0 = mat_p + uVar8;
    pdVar14 = local_58 + (uVar8 + 1) * lVar7;
    pdVar15 = local_58 + uVar8 * lVar7;
    pdVar11 = mat_q + uVar8;
    do {
      local_a0 = local_a0 + 1;
      pdVar11 = pdVar11 + 1;
      local_60 = uVar8;
      matrix_givens_rotation<double>(&local_48,&local_70,&alpha,&givens_c,epsilon);
      if (0 < cols) {
        pdVar4 = local_b8;
        dVar6 = beta;
        do {
          dVar18 = pdVar4[-1];
          pdVar4[-1] = alpha * dVar18 + *pdVar4 * -givens_c;
          *pdVar4 = dVar18 * givens_c + *pdVar4 * alpha;
          pdVar4 = pdVar4 + (long)dVar16;
          dVar6 = (double)((long)dVar6 + -1);
        } while (dVar6 != 0.0);
        if (0 < cols) {
          pdVar4 = local_a0;
          dVar6 = beta;
          do {
            dVar18 = pdVar4[-1];
            pdVar4[-1] = alpha * dVar18 + *pdVar4 * -givens_c;
            *pdVar4 = dVar18 * givens_c + *pdVar4 * alpha;
            pdVar4 = pdVar4 + (long)dVar16;
            dVar6 = (double)((long)dVar6 + -1);
          } while (dVar6 != 0.0);
        }
      }
      uVar8 = local_60 + 1;
      local_48 = local_58[local_60 + (long)((int)local_60 * cols)];
      local_70 = local_58[local_60 + (long)((int)uVar8 * cols)];
      matrix_givens_rotation<double>(&local_48,&local_70,&alpha,&givens_c,epsilon);
      if (0 < cols) {
        dVar6 = 0.0;
        do {
          dVar18 = pdVar15[(long)dVar6];
          dVar19 = pdVar14[(long)dVar6];
          pdVar15[(long)dVar6] = alpha * dVar18 + dVar19 * -givens_c;
          pdVar14[(long)dVar6] = dVar18 * givens_c + dVar19 * alpha;
          dVar6 = (double)((long)dVar6 + 1);
        } while (beta != dVar6);
      }
      if (0 < (int)local_4c) {
        pdVar4 = pdVar11;
        uVar12 = uVar9;
        do {
          dVar6 = pdVar4[-1];
          pdVar4[-1] = alpha * dVar6 + *pdVar4 * -givens_c;
          *pdVar4 = dVar6 * givens_c + *pdVar4 * alpha;
          pdVar4 = pdVar4 + lVar7;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      if ((long)local_60 < (long)((int)uVar3 + -2)) {
        local_48 = local_58[local_60 * lVar7 + uVar8];
        local_70 = pdVar1[local_60 + local_60 * lVar7 + 2];
      }
      local_b8 = local_b8 + 1;
      pdVar14 = pdVar14 + lVar7;
      pdVar15 = pdVar15 + lVar7;
    } while ((long)uVar8 <
             (long)buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8);
  }
  return;
}

Assistant:

void
matrix_gk_svd_step (int rows, int cols, T* mat_b, T* mat_q, T* mat_p,
    int p, int q, T const& epsilon)
{
    int const slice_length = cols - q - p;
    int const mat_sizes = slice_length * slice_length;
    std::vector<T> buffer(3 * mat_sizes);
    T* mat_b22 = &buffer[0];
    T* mat_b22_t = mat_b22 + mat_sizes;
    T* mat_tmp = mat_b22_t + mat_sizes;

    for (int i = 0; i < slice_length; ++i)
        for (int j = 0; j < slice_length; ++j)
            mat_b22[i * slice_length + j] = mat_b[(p + i) *  cols + (p + j)];
    for (int i = 0; i < slice_length; ++i)
        for (int j = 0; j < slice_length; ++j)
            mat_b22_t[i * slice_length + j] = mat_b22[j * slice_length + i];

    /* Slice outer product gives covariance matrix. */
    matrix_multiply(mat_b22, slice_length, slice_length, mat_b22_t,
        slice_length, mat_tmp);

    T mat_c[2 * 2];
    mat_c[0] = mat_tmp[(slice_length - 2) * slice_length + (slice_length - 2)];
    mat_c[1] = mat_tmp[(slice_length - 2) * slice_length + (slice_length - 1)];
    mat_c[2] = mat_tmp[(slice_length - 1) * slice_length + (slice_length - 2)];
    mat_c[3] = mat_tmp[(slice_length - 1) * slice_length + (slice_length - 1)];

    /* Use eigenvalue that is closer to the lower right entry of the slice. */
    T eig_1, eig_2;
    matrix_2x2_eigenvalues(mat_c, &eig_1, &eig_2);

    T diff1 = std::abs(mat_c[3] - eig_1);
    T diff2 = std::abs(mat_c[3] - eig_2);
    T mu = (diff1 < diff2) ? eig_1 : eig_2;

    /* Zero another entry bz applyting givens rotations. */
    int k = p;
    T alpha = mat_b[k * cols + k] * mat_b[k * cols + k] - mu;
    T beta = mat_b[k * cols + k] * mat_b[k * cols + (k + 1)];

    for (int k = p; k < cols - q - 1; ++k)
    {
        T givens_c, givens_s;
        matrix_givens_rotation(alpha, beta, &givens_c, &givens_s, epsilon);
        matrix_apply_givens_column(mat_b, cols, cols, k, k + 1, givens_c,
            givens_s);
        matrix_apply_givens_column(mat_p, cols, cols, k, k + 1, givens_c,
            givens_s);

        alpha = mat_b[k * cols + k];
        beta = mat_b[(k + 1) * cols + k];
        matrix_givens_rotation(alpha, beta, &givens_c, &givens_s, epsilon);
        internal::matrix_apply_givens_row(mat_b, cols, cols, k, k + 1,
            givens_c, givens_s);
        internal::matrix_apply_givens_column(mat_q, rows, cols, k, k + 1,
            givens_c, givens_s);

        if (k < (cols - q - 2))
        {
            alpha = mat_b[k * cols + (k + 1)];
            beta = mat_b[k * cols + (k + 2)];
        }
    }
}